

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::contains(UnicodeSet *this,UChar32 c)

{
  int iVar1;
  int32_t iVar2;
  int32_t i;
  UChar32 c_local;
  UnicodeSet *this_local;
  
  if (this->bmpSet == (BMPSet *)0x0) {
    if (this->stringSpan == (UnicodeSetStringSpan *)0x0) {
      if (c < 0x110000) {
        iVar2 = findCodePoint(this,c);
        this_local._7_1_ = (byte)iVar2 & 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = UnicodeSetStringSpan::contains(this->stringSpan,c);
    }
  }
  else {
    iVar1 = (*this->bmpSet->_vptr_BMPSet[2])(this->bmpSet,(ulong)(uint)c);
    this_local._7_1_ = (byte)iVar1;
  }
  return this_local._7_1_;
}

Assistant:

UBool UnicodeSet::contains(UChar32 c) const {
    // Set i to the index of the start item greater than ch
    // We know we will terminate without length test!
    // LATER: for large sets, add binary search
    //int32_t i = -1;
    //for (;;) {
    //    if (c < list[++i]) break;
    //}
    if (bmpSet != NULL) {
        return bmpSet->contains(c);
    }
    if (stringSpan != NULL) {
        return stringSpan->contains(c);
    }
    if (c >= UNICODESET_HIGH) { // Don't need to check LOW bound
        return FALSE;
    }
    int32_t i = findCodePoint(c);
    return (UBool)(i & 1); // return true if odd
}